

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall
despot::HierarchyCPT::SetParents
          (HierarchyCPT *this,int val,
          vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents)

{
  NamedVar *child;
  TabularCPT *this_00;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_40;
  
  this_00 = (TabularCPT *)operator_new(0x70);
  child = (this->super_CPT).super_Function.child_;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_40,parents);
  TabularCPT::TabularCPT
            (this_00,child,
             (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_40);
  (this->cpts_).super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
  _M_impl.super__Vector_impl_data._M_start[val] = this_00;
  std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
            (&local_40);
  return;
}

Assistant:

void HierarchyCPT::SetParents(int val, vector<NamedVar*> parents) {
	cpts_[val] = new TabularCPT(child_, parents);
}